

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_compressedBlockState_t *pZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  undefined4 uVar4;
  undefined4 uVar8;
  size_t sVar5;
  ZSTD_freeFunction p_Var6;
  ZSTD_allocFunction p_Var7;
  bool bVar9;
  undefined4 uVar10;
  ldmParams_t params_01;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint uVar14;
  uint uVar15;
  ZSTD_strategy ZVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  void *alloc;
  ulong uVar21;
  size_t sVar22;
  size_t sVar23;
  void *pvVar24;
  seqDef *psVar25;
  ZSTD_compressedBlockState_t *pZVar26;
  rawSeq *prVar27;
  BYTE *pBVar28;
  char *pcVar29;
  FSE_CTable *pFVar30;
  ulong uVar31;
  size_t buffInSize;
  void *pvVar32;
  ZSTD_Sequence *pZVar33;
  size_t sVar34;
  ZSTD_cwksp_alloc_phase_e ZVar35;
  ulong uVar36;
  ulong maxChunkSize;
  ldmEntry_t *__s;
  long lVar37;
  size_t buffOutSize;
  ZSTD_indexResetPolicy_e forceResetIndex;
  size_t err_code;
  BYTE *local_70;
  ZSTD_cwksp_alloc_phase_e *local_48;
  ulong uVar38;
  
  zc->isFirstBlock = 1;
  switchD_012b9b0d::default(&zc->appliedParams,params,0xd8);
  params_00 = &(zc->appliedParams).ldmParams;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
  }
  uVar36 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= uVar36) {
    uVar36 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar36 = 1;
  }
  maxChunkSize = (zc->appliedParams).maxBlockSize;
  if (uVar36 <= maxChunkSize) {
    maxChunkSize = uVar36;
  }
  uVar31 = 4 - (ulong)((zc->appliedParams).cParams.minMatch == 3 ||
                      (zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0);
  buffOutSize = 0;
  uVar21 = maxChunkSize / uVar31;
  buffInSize = 0;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      if (maxChunkSize < 0xff00ff00ff00ff00) {
        uVar38 = 0;
        if (maxChunkSize < 0x20000) {
          uVar38 = (ulong)(0x20000U - (int)maxChunkSize >> 0xb);
        }
        lVar37 = uVar38 + (maxChunkSize >> 8) + maxChunkSize;
        if (lVar37 == 0) goto LAB_018b3ab9;
      }
      else {
LAB_018b3ab9:
        lVar37 = -0x48;
      }
      buffOutSize = lVar37 + 1;
    }
    else {
      buffOutSize = 0;
    }
    buffInSize = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      buffInSize = uVar36 + maxChunkSize;
    }
  }
  cParams = &(zc->appliedParams).cParams;
  uVar4 = (zc->appliedParams).ldmParams.hashRateLog;
  uVar8 = (zc->appliedParams).ldmParams.windowLog;
  params_01.windowLog = uVar8;
  params_01.hashRateLog = uVar4;
  uVar10 = (zc->appliedParams).ldmParams.minMatchLength;
  uVar11 = params_00->enableLdm;
  uVar12 = params_00->hashLog;
  uVar13 = params_00->bucketSizeLog;
  params_01.bucketSizeLog = uVar13;
  params_01.hashLog = uVar12;
  params_01.enableLdm = uVar11;
  params_01.minMatchLength = uVar10;
  sVar22 = ZSTD_ldm_getMaxNbSeq(params_01,maxChunkSize);
  forceResetIndex = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    forceResetIndex = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  sVar23 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,buffInSize,buffOutSize,pledgedSrcSize,
                      (uint)((zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0),
                      (zc->appliedParams).maxBlockSize);
  if (0xffffffffffffff88 < sVar23) {
    return sVar23;
  }
  sVar5 = zc->staticSize;
  if (sVar5 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar32 = (zc->workspace).workspace;
  pvVar24 = (zc->workspace).workspaceEnd;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < sVar23 * 3) {
    bVar9 = false;
  }
  else {
    bVar9 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  if (((ulong)((long)pvVar24 - (long)pvVar32) < sVar23) || (bVar9)) {
    if (sVar5 != 0) {
      return 0xffffffffffffffc0;
    }
    p_Var6 = (zc->customMem).customFree;
    pvVar24 = (zc->customMem).opaque;
    (zc->workspace).initOnceStart = (void *)0x0;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x39 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    (zc->workspace).workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    if (pvVar32 != (void *)0x0) {
      if (p_Var6 == (ZSTD_freeFunction)0x0) {
        free(pvVar32);
      }
      else {
        (*p_Var6)(pvVar24,pvVar32);
      }
    }
    p_Var7 = (zc->customMem).customAlloc;
    if (p_Var7 == (ZSTD_allocFunction)0x0) {
      pZVar26 = (ZSTD_compressedBlockState_t *)malloc(sVar23);
    }
    else {
      pZVar26 = (ZSTD_compressedBlockState_t *)(*p_Var7)((zc->customMem).opaque,sVar23);
    }
    if (pZVar26 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    (zc->workspace).workspace = pZVar26;
    pvVar32 = (void *)((long)(pZVar26->entropy).huf.CTable + sVar23);
    (zc->workspace).workspaceEnd = pvVar32;
    (zc->workspace).objectEnd = pZVar26;
    (zc->workspace).tableValidEnd = pZVar26;
    pvVar32 = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
    (zc->workspace).initOnceStart = pvVar32;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    (zc->workspace).tableEnd = pZVar26;
    (zc->workspace).allocStart = pvVar32;
    (zc->workspace).allocFailed = '\0';
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    if ((long)sVar23 < 0x1600) {
      (zc->workspace).allocFailed = '\x01';
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)0x0;
      return 0xffffffffffffffc0;
    }
    pZVar2 = pZVar26 + 1;
    (zc->workspace).objectEnd = pZVar2;
    (zc->workspace).tableEnd = pZVar2;
    (zc->workspace).tableValidEnd = pZVar2;
    (zc->blockState).prevCBlock = pZVar26;
    if (sVar23 < 0x2c00) {
      (zc->workspace).allocFailed = '\x01';
      (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)0x0;
      return 0xffffffffffffffc0;
    }
    pZVar3 = pZVar26 + 2;
    (zc->workspace).objectEnd = pZVar3;
    (zc->workspace).tableEnd = pZVar3;
    (zc->workspace).tableValidEnd = pZVar3;
    (zc->blockState).nextCBlock = pZVar2;
    if (sVar23 < 0x4ed8) {
      (zc->workspace).allocFailed = '\x01';
      zc->entropyWorkspace = (U32 *)0x0;
      return 0xffffffffffffffc0;
    }
    pFVar30 = pZVar26[3].entropy.fse.matchlengthCTable + 0x71;
    (zc->workspace).objectEnd = pFVar30;
    (zc->workspace).tableValidEnd = pFVar30;
    zc->entropyWorkspace = (U32 *)pZVar3;
    (zc->workspace).tableEnd = pFVar30;
    (zc->workspace).allocFailed = '\0';
    forceResetIndex = ZSTDirp_reset;
  }
  else {
    (zc->workspace).tableEnd = (zc->workspace).objectEnd;
    (zc->workspace).allocStart = (void *)((ulong)pvVar24 & 0xffffffffffffffc0);
    (zc->workspace).allocFailed = '\0';
    if (1 < (int)(zc->workspace).phase) {
      (zc->workspace).phase = ZSTD_cwksp_alloc_aligned_init_once;
    }
  }
  local_48 = &(zc->workspace).phase;
  local_70 = &(zc->workspace).allocFailed;
  uVar17 = cParams->windowLog;
  uVar18 = cParams->chainLog;
  uVar19 = (zc->appliedParams).cParams.hashLog;
  uVar20 = (zc->appliedParams).cParams.searchLog;
  uVar14 = (zc->appliedParams).cParams.minMatch;
  uVar15 = (zc->appliedParams).cParams.targetLength;
  ZVar16 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar14;
  (zc->blockState).matchState.cParams.targetLength = uVar15;
  (zc->blockState).matchState.cParams.strategy = ZVar16;
  (zc->blockState).matchState.cParams.windowLog = uVar17;
  (zc->blockState).matchState.cParams.chainLog = uVar18;
  (zc->blockState).matchState.cParams.hashLog = uVar19;
  (zc->blockState).matchState.cParams.searchLog = uVar20;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = maxChunkSize;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  pZVar26 = (zc->blockState).prevCBlock;
  pZVar26->rep[0] = 1;
  pZVar26->rep[1] = 4;
  pZVar26->rep[2] = 8;
  (pZVar26->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar26->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar26->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar26->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  sVar23 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,&zc->workspace,cParams,
                      (zc->appliedParams).useRowMatchFinder,crp,forceResetIndex,
                      ZSTD_resetTarget_CCtx);
  if (0xffffffffffffff88 < sVar23) {
    return sVar23;
  }
  ZVar35 = *local_48;
  if ((int)ZVar35 < 2) {
    if (ZVar35 == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018b3db2:
      *local_48 = ZSTD_cwksp_alloc_aligned;
      ZVar35 = ZSTD_cwksp_alloc_aligned;
      goto LAB_018b3e33;
    }
    pvVar32 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
    uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar36);
    if (pvVar24 <= pvVar32) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar36 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_018b3db2;
    }
LAB_018b3e59:
    psVar25 = (seqDef *)0x0;
  }
  else {
LAB_018b3e33:
    uVar36 = uVar21 * 8 + 0x3f & 0xffffffffffffffc0;
    if (uVar36 == 0) goto LAB_018b3e59;
    psVar25 = (seqDef *)((long)(zc->workspace).allocStart - uVar36);
    if (psVar25 < (seqDef *)(zc->workspace).tableEnd) {
      *local_70 = '\x01';
      goto LAB_018b3e59;
    }
    if (psVar25 < (seqDef *)(zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = psVar25;
    }
    (zc->workspace).allocStart = psVar25;
  }
  (zc->seqStore).sequencesStart = psVar25;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    sVar34 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
    if ((int)ZVar35 < 2) {
      pvVar32 = (zc->workspace).workspaceEnd;
      pvVar24 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar24;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
      uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
      pvVar24 = (void *)((long)pvVar24 + uVar36);
      if (pvVar24 <= pvVar32) {
        (zc->workspace).objectEnd = pvVar24;
        (zc->workspace).tableEnd = pvVar24;
        if (uVar36 != 0) {
          (zc->workspace).tableValidEnd = pvVar24;
        }
        *local_48 = ZSTD_cwksp_alloc_aligned;
        goto LAB_018b3eee;
      }
LAB_018b3f14:
      __s = (ldmEntry_t *)0x0;
    }
    else {
LAB_018b3eee:
      uVar36 = sVar34 + 0x3f & 0xffffffffffffffc0;
      if (uVar36 == 0) goto LAB_018b3f14;
      __s = (ldmEntry_t *)((long)(zc->workspace).allocStart - uVar36);
      if (__s < (ldmEntry_t *)(zc->workspace).tableEnd) {
        *local_70 = '\x01';
        goto LAB_018b3f14;
      }
      if (__s < (ldmEntry_t *)(zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = __s;
      }
      (zc->workspace).allocStart = __s;
    }
    (zc->ldmState).hashTable = __s;
    switchD_012e3010::default(__s,0,sVar34);
    ZVar35 = (zc->workspace).phase;
    if ((int)ZVar35 < 2) {
      if (ZVar35 == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018b4092:
        *local_48 = ZSTD_cwksp_alloc_aligned;
        ZVar35 = ZSTD_cwksp_alloc_aligned;
        goto LAB_018b40aa;
      }
      pvVar32 = (zc->workspace).workspaceEnd;
      pvVar24 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar24;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
      uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
      pvVar24 = (void *)((long)pvVar24 + uVar36);
      if (pvVar24 <= pvVar32) {
        (zc->workspace).objectEnd = pvVar24;
        (zc->workspace).tableEnd = pvVar24;
        if (uVar36 != 0) {
          (zc->workspace).tableValidEnd = pvVar24;
        }
        goto LAB_018b4092;
      }
LAB_018b40d4:
      prVar27 = (rawSeq *)0x0;
    }
    else {
LAB_018b40aa:
      uVar36 = sVar22 * 0xc + 0x3f & 0xffffffffffffffc0;
      if (uVar36 == 0) goto LAB_018b40d4;
      prVar27 = (rawSeq *)((long)(zc->workspace).allocStart - uVar36);
      if (prVar27 < (rawSeq *)(zc->workspace).tableEnd) {
        *local_70 = '\x01';
        goto LAB_018b40d4;
      }
      if (prVar27 < (rawSeq *)(zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = prVar27;
      }
      (zc->workspace).allocStart = prVar27;
    }
    zc->ldmSequences = prVar27;
    zc->maxNbLdmSequences = sVar22;
    *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
    (zc->ldmState).window.base = " ";
    (zc->ldmState).window.dictBase = " ";
    (zc->ldmState).window.dictLimit = 2;
    (zc->ldmState).window.lowLimit = 2;
    (zc->ldmState).window.nextSrc = (BYTE *)"id-ce-certificatePolicies";
    (zc->ldmState).loadedDictEnd = 0;
  }
  if ((zc->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0) {
    sVar22 = (maxChunkSize >> 10) + maxChunkSize / 3 + 2;
    zc->extSeqBufCapacity = sVar22;
    if ((int)ZVar35 < 2) {
      pvVar32 = (zc->workspace).workspaceEnd;
      pvVar24 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar24;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
      uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
      pvVar24 = (void *)((long)pvVar24 + uVar36);
      if (pvVar24 <= pvVar32) {
        (zc->workspace).objectEnd = pvVar24;
        (zc->workspace).tableEnd = pvVar24;
        if (uVar36 != 0) {
          (zc->workspace).tableValidEnd = pvVar24;
        }
        *local_48 = ZSTD_cwksp_alloc_aligned;
        ZVar35 = ZSTD_cwksp_alloc_aligned;
        goto LAB_018b41d9;
      }
LAB_018b41ff:
      pZVar33 = (ZSTD_Sequence *)0x0;
    }
    else {
LAB_018b41d9:
      uVar36 = sVar22 * 0x10 + 0x3f & 0xffffffffffffffc0;
      if (uVar36 == 0) goto LAB_018b41ff;
      pZVar33 = (ZSTD_Sequence *)((long)(zc->workspace).allocStart - uVar36);
      if (pZVar33 < (ZSTD_Sequence *)(zc->workspace).tableEnd) {
        *local_70 = '\x01';
        goto LAB_018b41ff;
      }
      if (pZVar33 < (ZSTD_Sequence *)(zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pZVar33;
      }
      (zc->workspace).allocStart = pZVar33;
    }
    zc->extSeqBuf = pZVar33;
  }
  if ((int)ZVar35 < 3) {
    if (0 < (int)ZVar35) {
LAB_018b422e:
      *local_48 = ZSTD_cwksp_alloc_buffers;
      ZVar35 = ZSTD_cwksp_alloc_buffers;
      goto LAB_018b423a;
    }
    pvVar32 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
    uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar36);
    if (pvVar24 <= pvVar32) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar36 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_018b422e;
    }
    (zc->seqStore).litStart = (BYTE *)0x0;
    (zc->seqStore).maxNbLit = maxChunkSize;
    zc->bufferedPolicy = zbuff;
    zc->inBuffSize = buffInSize;
    pvVar32 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
    uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar36);
    if (pvVar24 <= pvVar32) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar36 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      *local_48 = ZSTD_cwksp_alloc_buffers;
      ZVar35 = ZSTD_cwksp_alloc_buffers;
      goto LAB_018b4296;
    }
    zc->inBuff = (char *)0x0;
    zc->outBuffSize = buffOutSize;
    pvVar32 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
    uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar36);
    if (pvVar24 <= pvVar32) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar36 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      *local_48 = ZSTD_cwksp_alloc_buffers;
      ZVar35 = ZSTD_cwksp_alloc_buffers;
      goto LAB_018b42dc;
    }
LAB_018b42f9:
    pcVar29 = (char *)0x0;
  }
  else {
LAB_018b423a:
    if (maxChunkSize == 0xffffffffffffffe0) {
LAB_018b425c:
      pBVar28 = (BYTE *)0x0;
    }
    else {
      pBVar28 = (BYTE *)((long)(zc->workspace).allocStart + (-0x20 - maxChunkSize));
      if (pBVar28 < (zc->workspace).tableEnd) {
        *local_70 = '\x01';
        goto LAB_018b425c;
      }
      if (pBVar28 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar28;
      }
      (zc->workspace).allocStart = pBVar28;
    }
    (zc->seqStore).litStart = pBVar28;
    (zc->seqStore).maxNbLit = maxChunkSize;
    zc->bufferedPolicy = zbuff;
    zc->inBuffSize = buffInSize;
LAB_018b4296:
    if (buffInSize == 0) {
LAB_018b42b3:
      pcVar29 = (char *)0x0;
    }
    else {
      pcVar29 = (char *)((long)(zc->workspace).allocStart - buffInSize);
      if (pcVar29 < (zc->workspace).tableEnd) {
        *local_70 = '\x01';
        goto LAB_018b42b3;
      }
      if (pcVar29 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pcVar29;
      }
      (zc->workspace).allocStart = pcVar29;
    }
    zc->inBuff = pcVar29;
    zc->outBuffSize = buffOutSize;
LAB_018b42dc:
    if (buffOutSize == 0) goto LAB_018b42f9;
    pcVar29 = (char *)((long)(zc->workspace).allocStart - buffOutSize);
    if (pcVar29 < (zc->workspace).tableEnd) {
      *local_70 = '\x01';
      goto LAB_018b42f9;
    }
    if (pcVar29 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar29;
    }
    (zc->workspace).allocStart = pcVar29;
  }
  zc->outBuff = pcVar29;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    sVar34 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                    (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    if ((int)ZVar35 < 3) {
      pvVar32 = (zc->workspace).workspaceEnd;
      pvVar24 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar24;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
      uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
      pvVar24 = (void *)((long)pvVar24 + uVar36);
      if (pvVar24 <= pvVar32) {
        (zc->workspace).objectEnd = pvVar24;
        (zc->workspace).tableEnd = pvVar24;
        if (uVar36 != 0) {
          (zc->workspace).tableValidEnd = pvVar24;
        }
        *local_48 = ZSTD_cwksp_alloc_buffers;
        goto LAB_018b4394;
      }
LAB_018b43b0:
      pBVar28 = (BYTE *)0x0;
    }
    else {
LAB_018b4394:
      pBVar28 = (BYTE *)((long)(zc->workspace).allocStart - sVar34);
      if (pBVar28 < (zc->workspace).tableEnd) {
        *local_70 = '\x01';
        goto LAB_018b43b0;
      }
      if (pBVar28 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar28;
      }
      (zc->workspace).allocStart = pBVar28;
    }
    (zc->ldmState).bucketOffsets = pBVar28;
    switchD_012e3010::default(pBVar28,0,sVar34);
    ZVar35 = (zc->workspace).phase;
  }
  (zc->externSeqStore).posInSequence = 0;
  (zc->externSeqStore).size = 0;
  (zc->externSeqStore).seq = (rawSeq *)0x0;
  (zc->externSeqStore).pos = 0;
  (zc->externSeqStore).capacity = 0;
  (zc->seqStore).maxNbSeq = uVar21;
  if ((int)ZVar35 < 3) {
    if (0 < (int)ZVar35) {
LAB_018b4514:
      *local_48 = ZSTD_cwksp_alloc_buffers;
      goto LAB_018b451b;
    }
    pvVar32 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
    uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar36);
    if (pvVar24 <= pvVar32) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar36 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      goto LAB_018b4514;
    }
    (zc->seqStore).llCode = (BYTE *)0x0;
    pvVar32 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
    uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar36);
    if (pvVar24 <= pvVar32) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar36 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      *local_48 = ZSTD_cwksp_alloc_buffers;
      goto LAB_018b455f;
    }
    (zc->seqStore).mlCode = (BYTE *)0x0;
    pvVar32 = (zc->workspace).workspaceEnd;
    pvVar24 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar24;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar32 & 0xffffffffffffffc0);
    uVar36 = (ulong)(-(int)pvVar24 & 0x3f);
    pvVar24 = (void *)((long)pvVar24 + uVar36);
    if (pvVar24 <= pvVar32) {
      (zc->workspace).objectEnd = pvVar24;
      (zc->workspace).tableEnd = pvVar24;
      if (uVar36 != 0) {
        (zc->workspace).tableValidEnd = pvVar24;
      }
      *local_48 = ZSTD_cwksp_alloc_buffers;
      goto LAB_018b459e;
    }
  }
  else {
LAB_018b451b:
    if (maxChunkSize < uVar31) {
LAB_018b453d:
      pBVar28 = (BYTE *)0x0;
    }
    else {
      pBVar28 = (BYTE *)((long)(zc->workspace).allocStart - uVar21);
      if (pBVar28 < (zc->workspace).tableEnd) {
        *local_70 = '\x01';
        goto LAB_018b453d;
      }
      if (pBVar28 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar28;
      }
      (zc->workspace).allocStart = pBVar28;
    }
    (zc->seqStore).llCode = pBVar28;
LAB_018b455f:
    if (maxChunkSize < uVar31) {
LAB_018b457c:
      pBVar28 = (BYTE *)0x0;
    }
    else {
      pBVar28 = (BYTE *)((long)(zc->workspace).allocStart - uVar21);
      if (pBVar28 < (zc->workspace).tableEnd) {
        *local_70 = '\x01';
        goto LAB_018b457c;
      }
      if (pBVar28 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar28;
      }
      (zc->workspace).allocStart = pBVar28;
    }
    (zc->seqStore).mlCode = pBVar28;
LAB_018b459e:
    if (uVar31 <= maxChunkSize) {
      pBVar28 = (BYTE *)((long)(zc->workspace).allocStart - uVar21);
      if ((zc->workspace).tableEnd <= pBVar28) {
        if (pBVar28 < (zc->workspace).tableValidEnd) {
          (zc->workspace).tableValidEnd = pBVar28;
        }
        (zc->workspace).allocStart = pBVar28;
        goto LAB_018b45d6;
      }
      *local_70 = '\x01';
    }
  }
  pBVar28 = (BYTE *)0x0;
LAB_018b45d6:
  (zc->seqStore).ofCode = pBVar28;
  zc->initialized = 1;
  return 0;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, ZSTD_hasExtSeqProd(params));
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, ZSTD_hasExtSeqProd(params), params->maxBlockSize);

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            int resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (ZSTD_hasExtSeqProd(params)) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->extSeqBufCapacity = maxNbExternalSeq;
            zc->extSeqBuf =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}